

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O0

void __thiscall
GrcManager::WalkDirectivesTree
          (GrcManager *this,RefAST *ast,int *pnCollisionFix,int *pnAutoKern,
          int *pnCollisionThreshold,int *pnDir)

{
  bool bVar1;
  int iVar2;
  ExpressionType EVar3;
  AST *pAVar4;
  GrcManager *this_00;
  AST *pfM;
  Symbol pGVar5;
  int *in_RCX;
  int *in_RDX;
  RefCount<AST> *in_RSI;
  GrcManager *in_RDI;
  int *in_R8;
  int *in_R9;
  Symbol psym;
  bool fM;
  int nValue;
  RefAST astValue;
  string staName;
  RefAST astDirective;
  AST *in_stack_fffffffffffff988;
  undefined4 in_stack_fffffffffffff990;
  SymbolType in_stack_fffffffffffff994;
  GrcSymbolTableEntry *in_stack_fffffffffffff998;
  allocator *in_stack_fffffffffffff9a0;
  undefined7 in_stack_fffffffffffff9a8;
  undefined1 in_stack_fffffffffffff9af;
  allocator *in_stack_fffffffffffff9b0;
  AST *in_stack_fffffffffffff9b8;
  undefined7 in_stack_fffffffffffff9c0;
  undefined1 in_stack_fffffffffffff9c7;
  GrpLineAndFile *in_stack_fffffffffffff9c8;
  GrcSymbolTable *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  int in_stack_fffffffffffff9dc;
  GrcErrorList *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffff9e8;
  int in_stack_fffffffffffff9ec;
  GrcErrorList *in_stack_fffffffffffff9f0;
  allocator *in_stack_fffffffffffff9f8;
  undefined7 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa07;
  allocator local_4f1;
  string local_4f0 [87];
  allocator local_499;
  string local_498 [87];
  undefined1 local_441 [88];
  undefined1 local_3e9 [88];
  undefined1 local_391 [81];
  string local_340 [39];
  undefined1 local_319 [88];
  allocator local_2c1;
  string local_2c0 [87];
  allocator local_269;
  string local_268 [40];
  AST local_240;
  allocator local_211;
  string local_210 [32];
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [80];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  GrcSymbolTableEntry *local_110;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [43];
  byte local_85;
  int local_84;
  RefCount<AST> local_80;
  RefCount<AST> local_78;
  RefCount<AST> local_70;
  string local_68 [48];
  RefCount<AST> local_38;
  int *local_30;
  int *local_28;
  int *local_20;
  int *local_18;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  RefCount<AST>::operator->(in_RSI);
  AST::getFirstChild(in_stack_fffffffffffff988);
  while (pAVar4 = RefCount::operator_cast_to_AST_((RefCount *)&local_38), pAVar4 != (AST *)0x0) {
    RefCount<AST>::operator->(&local_38);
    AST::getFirstChild(in_stack_fffffffffffff988);
    this_00 = (GrcManager *)RefCount<AST>::operator->(&local_70);
    AST::getText_abi_cxx11_(in_stack_fffffffffffff9b8);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    pAVar4 = RefCount<AST>::operator->(&local_38);
    AST::getFirstChild(in_stack_fffffffffffff988);
    pfM = RefCount<AST>::operator->(&local_80);
    AST::getNextSibling(in_stack_fffffffffffff988);
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    local_84 = -1;
    local_85 = 0;
    RefCount<AST>::operator->(&local_78);
    iVar2 = AST::getType((AST *)0x264d79);
    if (iVar2 == 0x11) {
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                 (RefCount<AST> *)in_stack_fffffffffffff998);
      local_84 = NumericValue(this_00,&pAVar4->down,(bool *)pfM);
      RefCount<AST>::~RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    }
    else {
      RefCount<AST>::operator->(&local_78);
      iVar2 = AST::getType((AST *)0x264ed0);
      if (iVar2 == 0x51) {
        local_84 = 0;
      }
      else {
        RefCount<AST>::operator->(&local_78);
        iVar2 = AST::getType((AST *)0x264f19);
        if (iVar2 == 0x50) {
          local_84 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_b0,"Invalid value for directive ",&local_b1);
          std::__cxx11::string::string(local_d8,local_68);
          RefCount<AST>::RefCount
                    ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                     (RefCount<AST> *)in_stack_fffffffffffff998);
          LineAndFile(in_RDI,in_RSI);
          GrcErrorList::AddError
                    (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                     (GdlObject *)in_stack_fffffffffffff9e0,
                     (string *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                     (string *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x264ffa);
          RefCount<AST>::~RefCount
                    ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990))
          ;
          std::__cxx11::string::~string(local_d8);
          std::__cxx11::string::~string(local_b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_b1);
        }
      }
    }
    SymbolTable(in_RDI);
    std::__cxx11::string::string(local_130,local_68);
    pGVar5 = GrcSymbolTable::FindSymbol
                       (in_stack_fffffffffffff9d0,(string *)in_stack_fffffffffffff9c8);
    std::__cxx11::string::~string(local_130);
    local_110 = pGVar5;
    if ((pGVar5 == (Symbol)0x0) ||
       (bVar1 = GrcSymbolTableEntry::FitsSymbolType
                          (in_stack_fffffffffffff998,in_stack_fffffffffffff994), !bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"Invalid directive: ",&local_151);
      std::__cxx11::string::string(local_178,local_68);
      RefCount<AST>::RefCount
                ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                 (RefCount<AST> *)in_stack_fffffffffffff998);
      LineAndFile(in_RDI,in_RSI);
      GrcErrorList::AddError
                (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                 (GdlObject *)in_stack_fffffffffffff9e0,
                 (string *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                 (string *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x265249);
      RefCount<AST>::~RefCount
                ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
    }
    else {
      if (((local_85 & 1) != 0) &&
         (EVar3 = GrcSymbolTableEntry::ExpType(local_110), EVar3 != kexptMeas)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1c8,"The ",&local_1c9);
        std::__cxx11::string::string(local_1f0,local_68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_210," directive does not expect a scaled value",&local_211);
        RefCount<AST>::RefCount
                  ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                   (RefCount<AST> *)in_stack_fffffffffffff998);
        LineAndFile(in_RDI,in_RSI);
        in_stack_fffffffffffff988 = &local_240;
        GrcErrorList::AddError
                  (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc,
                   (GdlObject *)in_stack_fffffffffffff9d0,(string *)in_stack_fffffffffffff9c8,
                   (string *)CONCAT17(in_stack_fffffffffffff9c7,in_stack_fffffffffffff9c0),
                   (string *)in_stack_fffffffffffff9b8,(GrpLineAndFile *)in_stack_fffffffffffff9f0);
        GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x26548e);
        RefCount<AST>::~RefCount
                  ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string(local_1c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                              (char *)in_stack_fffffffffffff988);
      if (bVar1) {
        SetAttrOverride((GrcManager *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                        SUB81((ulong)in_stack_fffffffffffff988 >> 0x38,0));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                (char *)in_stack_fffffffffffff988);
        if (bVar1) {
          SetCodePage((GrcManager *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                      (utf16)((ulong)in_stack_fffffffffffff988 >> 0x30));
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                  (char *)in_stack_fffffffffffff988);
          if (bVar1) {
            SetMaxRuleLoop((GrcManager *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                           (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                    ,(char *)in_stack_fffffffffffff988);
            if (bVar1) {
              SetMaxBackup((GrcManager *)
                           CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                           (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_fffffffffffff994,
                                                  in_stack_fffffffffffff990),
                                      (char *)in_stack_fffffffffffff988);
              if (bVar1) {
                SetMUnits((GrcManager *)
                          CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                          (int)((ulong)in_stack_fffffffffffff988 >> 0x20));
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)CONCAT44(in_stack_fffffffffffff994,
                                                    in_stack_fffffffffffff990),
                                        (char *)in_stack_fffffffffffff988);
                if (bVar1) {
                  if ((local_85 & 1) == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_268,"The PointRadius directive requires a scaled value",
                               &local_269);
                    RefCount<AST>::RefCount
                              ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                               (RefCount<AST> *)in_stack_fffffffffffff998);
                    LineAndFile(in_RDI,in_RSI);
                    GrcErrorList::AddError
                              ((GrcErrorList *)
                               CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                               (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                               (GdlObject *)in_stack_fffffffffffff9f0,
                               (string *)
                               CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                               (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                    GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x265803);
                    RefCount<AST>::~RefCount
                              ((RefCount<AST> *)
                               CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                    std::__cxx11::string::~string(local_268);
                    std::allocator<char>::~allocator((allocator<char> *)&local_269);
                  }
                  MUnits((GrcManager *)0x2658d9);
                  SetPointRadius((GrcManager *)
                                 CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990),
                                 (int)((ulong)in_stack_fffffffffffff988 >> 0x20),
                                 (int)in_stack_fffffffffffff988);
                }
                else {
                  in_stack_fffffffffffffa07 =
                       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)CONCAT44(in_stack_fffffffffffff994,
                                                   in_stack_fffffffffffff990),
                                       (char *)in_stack_fffffffffffff988);
                  if ((bool)in_stack_fffffffffffffa07) {
                    if (local_18 == (int *)0x0) {
                      in_stack_fffffffffffff9f8 = &local_2c1;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                (local_2c0,
                                 "The CollisionFix directive must be indicated directly on a pass",
                                 in_stack_fffffffffffff9f8);
                      RefCount<AST>::RefCount
                                ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                 (RefCount<AST> *)in_stack_fffffffffffff998);
                      LineAndFile(in_RDI,in_RSI);
                      GrcErrorList::AddError
                                ((GrcErrorList *)
                                 CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                                 (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                 (GdlObject *)in_stack_fffffffffffff9f0,
                                 (string *)
                                 CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                                 (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                      GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x2659d1);
                      RefCount<AST>::~RefCount
                                ((RefCount<AST> *)
                                 CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                      std::__cxx11::string::~string(local_2c0);
                      std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                    }
                    else {
                      in_stack_fffffffffffff9f0 =
                           (GrcErrorList *)RefCount<AST>::operator->(&local_78);
                      in_stack_fffffffffffff9ec = AST::getType((AST *)0x265aaa);
                      if (in_stack_fffffffffffff9ec == 0x50) {
                        *local_18 = 3;
                      }
                      else if ((local_84 < 8) && (-1 < local_84)) {
                        *local_18 = local_84;
                      }
                      else {
                        in_stack_fffffffffffff9e0 = (GrcErrorList *)local_319;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)(local_319 + 1),
                                   "The CollisionFix value must be between 0 and ",
                                   (allocator *)in_stack_fffffffffffff9e0);
                        std::__cxx11::to_string(in_stack_fffffffffffff9dc);
                        RefCount<AST>::RefCount
                                  ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                   (RefCount<AST> *)in_stack_fffffffffffff998);
                        LineAndFile(in_RDI,in_RSI);
                        GrcErrorList::AddError
                                  (in_stack_fffffffffffff9f0,in_stack_fffffffffffff9ec,
                                   (GdlObject *)in_stack_fffffffffffff9e0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
                                   (string *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
                        GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x265b97);
                        RefCount<AST>::~RefCount
                                  ((RefCount<AST> *)
                                   CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                        std::__cxx11::string::~string(local_340);
                        std::__cxx11::string::~string((string *)(local_319 + 1));
                        std::allocator<char>::~allocator((allocator<char> *)local_319);
                        *local_18 = 7;
                      }
                    }
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)CONCAT44(in_stack_fffffffffffff994,
                                                        in_stack_fffffffffffff990),
                                            (char *)in_stack_fffffffffffff988);
                    in_stack_fffffffffffff9dc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9dc);
                    if (bVar1) {
                      if (local_20 == (int *)0x0) {
                        in_stack_fffffffffffff9d0 = (GrcSymbolTable *)local_391;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)(local_391 + 1),
                                   "The AutoKern directive must be indicated directly on a pass",
                                   (allocator *)in_stack_fffffffffffff9d0);
                        RefCount<AST>::RefCount
                                  ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                   (RefCount<AST> *)in_stack_fffffffffffff998);
                        LineAndFile(in_RDI,in_RSI);
                        GrcErrorList::AddError
                                  ((GrcErrorList *)
                                   CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                                   (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                   (GdlObject *)in_stack_fffffffffffff9f0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                                   (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                        GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x265d7a);
                        RefCount<AST>::~RefCount
                                  ((RefCount<AST> *)
                                   CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                        std::__cxx11::string::~string((string *)(local_391 + 1));
                        std::allocator<char>::~allocator((allocator<char> *)local_391);
                      }
                      else if (((local_84 == 0) || (local_84 == 1)) || (local_84 == 2)) {
                        *local_20 = local_84;
                      }
                      else {
                        in_stack_fffffffffffff9c8 = (GrpLineAndFile *)local_3e9;
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)(local_3e9 + 1),
                                   "The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)"
                                   ,(allocator *)in_stack_fffffffffffff9c8);
                        RefCount<AST>::RefCount
                                  ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                   (RefCount<AST> *)in_stack_fffffffffffff998);
                        LineAndFile(in_RDI,in_RSI);
                        GrcErrorList::AddWarning
                                  ((GrcErrorList *)
                                   CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                                   (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                   (GdlObject *)in_stack_fffffffffffff9f0,
                                   (string *)
                                   CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                                   (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                        GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x265ef6);
                        RefCount<AST>::~RefCount
                                  ((RefCount<AST> *)
                                   CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                        std::__cxx11::string::~string((string *)(local_3e9 + 1));
                        std::allocator<char>::~allocator((allocator<char> *)local_3e9);
                      }
                    }
                    else {
                      in_stack_fffffffffffff9c7 =
                           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)CONCAT44(in_stack_fffffffffffff994,
                                                       in_stack_fffffffffffff990),
                                           (char *)in_stack_fffffffffffff988);
                      if ((bool)in_stack_fffffffffffff9c7) {
                        if (local_28 == (int *)0x0) {
                          in_stack_fffffffffffff9b8 = (AST *)local_441;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)(local_441 + 1),
                                     "The CollisionThreshold directive must be indicated directly on a pass"
                                     ,(allocator *)in_stack_fffffffffffff9b8);
                          RefCount<AST>::RefCount
                                    ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                     (RefCount<AST> *)in_stack_fffffffffffff998);
                          LineAndFile(in_RDI,in_RSI);
                          GrcErrorList::AddError
                                    ((GrcErrorList *)
                                     CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                                     (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                     (GdlObject *)in_stack_fffffffffffff9f0,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                                     (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x266096);
                          RefCount<AST>::~RefCount
                                    ((RefCount<AST> *)
                                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                          std::__cxx11::string::~string((string *)(local_441 + 1));
                          std::allocator<char>::~allocator((allocator<char> *)local_441);
                        }
                        else if ((local_84 < 1) || (0xff < local_84)) {
                          in_stack_fffffffffffff9b0 = &local_499;
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_498,
                                     "The CollisionThreshold value must be between 1 and 255",
                                     in_stack_fffffffffffff9b0);
                          RefCount<AST>::RefCount
                                    ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                     (RefCount<AST> *)in_stack_fffffffffffff998);
                          LineAndFile(in_RDI,in_RSI);
                          GrcErrorList::AddError
                                    ((GrcErrorList *)
                                     CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00),
                                     (int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                     (GdlObject *)in_stack_fffffffffffff9f0,
                                     (string *)
                                     CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8),
                                     (GrpLineAndFile *)in_stack_fffffffffffff9e0);
                          GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x266203);
                          RefCount<AST>::~RefCount
                                    ((RefCount<AST> *)
                                     CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
                          std::__cxx11::string::~string(local_498);
                          std::allocator<char>::~allocator((allocator<char> *)&local_499);
                        }
                        else {
                          *local_28 = local_84;
                        }
                      }
                      else {
                        in_stack_fffffffffffff9af =
                             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)CONCAT44(in_stack_fffffffffffff994,
                                                         in_stack_fffffffffffff990),
                                             (char *)in_stack_fffffffffffff988);
                        if ((bool)in_stack_fffffffffffff9af) {
                          if (local_30 == (int *)0x0) {
                            in_stack_fffffffffffff9a0 = &local_4f1;
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_4f0,
                                       "The Direction directive must be indicated directly on a pass"
                                       ,in_stack_fffffffffffff9a0);
                            RefCount<AST>::RefCount
                                      ((RefCount<AST> *)in_stack_fffffffffffff9a0,
                                       (RefCount<AST> *)in_stack_fffffffffffff998);
                            LineAndFile(in_RDI,in_RSI);
                            GrcErrorList::AddError
                                      ((GrcErrorList *)
                                       CONCAT17(in_stack_fffffffffffffa07,in_stack_fffffffffffffa00)
                                       ,(int)((ulong)in_stack_fffffffffffff9f8 >> 0x20),
                                       (GdlObject *)in_stack_fffffffffffff9f0,
                                       (string *)
                                       CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8)
                                       ,(GrpLineAndFile *)in_stack_fffffffffffff9e0);
                            GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x2663a3);
                            RefCount<AST>::~RefCount
                                      ((RefCount<AST> *)
                                       CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990)
                                      );
                            std::__cxx11::string::~string(local_4f0);
                            std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
                          }
                          else {
                            *local_30 = local_84;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    in_stack_fffffffffffff998 = (GrcSymbolTableEntry *)RefCount<AST>::operator->(&local_38);
    AST::getNextSibling(in_stack_fffffffffffff988);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffff9b0,
               (RefCount<AST> *)CONCAT17(in_stack_fffffffffffff9af,in_stack_fffffffffffff9a8));
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    RefCount<AST>::~RefCount
              ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
    std::__cxx11::string::~string(local_68);
  }
  RefCount<AST>::~RefCount
            ((RefCount<AST> *)CONCAT44(in_stack_fffffffffffff994,in_stack_fffffffffffff990));
  return;
}

Assistant:

void GrcManager::WalkDirectivesTree(RefAST ast, int * pnCollisionFix, int * pnAutoKern,
	int * pnCollisionThreshold, int * pnDir)
{
	Assert(ast->getType() == Zdirectives);

	RefAST astDirective = ast->getFirstChild();
	while (astDirective)
	{
		std::string staName = astDirective->getFirstChild()->getText();
		//	For now, all directives have numeric or boolean values.
		RefAST astValue = astDirective->getFirstChild()->getNextSibling();
		Assert(astValue);
		int nValue = -1;
		bool fM = false;
		if (astValue->getType() == LIT_INT)
			nValue = NumericValue(astValue, &fM);
		else if (astValue->getType() == LITERAL_false)
			nValue = 0;
		else if (astValue->getType() == LITERAL_true)
			nValue = 1;
		else
		{
			g_errorList.AddError(1195, NULL,
				"Invalid value for directive ", staName,
				LineAndFile(ast));
		}

		Symbol psym = SymbolTable()->FindSymbol(staName);
		if (!psym || !psym->FitsSymbolType(ksymtDirective))
			g_errorList.AddError(1133, NULL,
				"Invalid directive: ",
				staName,
				LineAndFile(ast));
		else
		{
			if (fM && psym->ExpType() != kexptMeas)
				g_errorList.AddError(1134, NULL,
					"The ",
					staName,
					" directive does not expect a scaled value",
					LineAndFile(ast));

			if (staName == "AttributeOverride")
				SetAttrOverride(nValue != 0);
			
			else if (staName == "CodePage")
				SetCodePage(nValue);

			else if (staName == "MaxRuleLoop")
				SetMaxRuleLoop(nValue);

			else if (staName == "MaxBackup")
				SetMaxBackup(nValue);

			else if (staName == "MUnits")
				SetMUnits(nValue);

			else if (staName == "PointRadius")
			{
				Assert(psym->ExpType() == kexptMeas);
				if (!fM)
					g_errorList.AddError(1135, NULL,
						"The PointRadius directive requires a scaled value",
						LineAndFile(ast));
				SetPointRadius(nValue, MUnits());
			}
			else if (staName == "CollisionFix")
			{
				if (pnCollisionFix == NULL)
					g_errorList.AddError(1185, NULL,
						"The CollisionFix directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
				{
					if (astValue->getType() == LITERAL_true)
						*pnCollisionFix = 3;	// default; should this be 1??
					else if (nValue > kMaxColIterations || nValue < 0)
					{
						g_errorList.AddError(1186, NULL,
							"The CollisionFix value must be between 0 and ",
							std::to_string(kMaxColIterations),
							LineAndFile(ast));
						*pnCollisionFix = kMaxColIterations;
					}
					else
						*pnCollisionFix = nValue;
				}
			}
			else if (staName == "AutoKern")
			{
				if (pnAutoKern == NULL)
					g_errorList.AddError(1189, NULL,
						"The AutoKern directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue != kakNone && nValue != kakFull && nValue != kakNoSpace)
					g_errorList.AddWarning(1516, NULL,
						"The AutoKern value should be 0 (NONE), 1 (FULL), or 2 (NOSPACE)",
						LineAndFile(ast));
				else
					*pnAutoKern = nValue;
			}
			else if (staName == "CollisionThreshold")
			{
				if (pnCollisionThreshold == NULL)
					g_errorList.AddError(1190, NULL,
						"The CollisionThreshold directive must be indicated directly on a pass",
						LineAndFile(ast));
				else if (nValue < 1 || nValue > 255)
					g_errorList.AddError(1191, NULL,
						"The CollisionThreshold value must be between 1 and 255",
						LineAndFile(ast));
				else
					*pnCollisionThreshold = nValue;
			}
			else if (staName == "Direction")
			{
				if (pnDir == NULL)
					g_errorList.AddError(1194, NULL,
						"The Direction directive must be indicated directly on a pass",
						LineAndFile(ast));
				else
					*pnDir = nValue;
			}
			else
			{
				Assert(false);
			}
		}

		astDirective = astDirective->getNextSibling();
	}
}